

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.h
# Opt level: O1

void __thiscall SQFuncState::AddDefaultParam(SQFuncState *this,SQInteger trg)

{
  ulong uVar1;
  ulong uVar2;
  SQUnsignedInteger SVar3;
  longlong *plVar4;
  SQUnsignedInteger SVar5;
  
  uVar1 = (this->_defaultparams)._size;
  uVar2 = (this->_defaultparams)._allocated;
  if (uVar2 <= uVar1) {
    SVar3 = uVar1 * 2;
    SVar5 = 4;
    if (SVar3 != 0) {
      SVar5 = SVar3;
    }
    plVar4 = (longlong *)sq_vm_realloc((this->_defaultparams)._vals,uVar2 << 3,SVar5 * 8);
    (this->_defaultparams)._vals = plVar4;
    (this->_defaultparams)._allocated = SVar5;
  }
  SVar3 = (this->_defaultparams)._size;
  (this->_defaultparams)._size = SVar3 + 1;
  (this->_defaultparams)._vals[SVar3] = trg;
  return;
}

Assistant:

void AddDefaultParam(SQInteger trg) { _defaultparams.push_back(trg); }